

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_control.c
# Opt level: O0

int volume_control_segment_mix(mixed_segment *segment)

{
  float local_4c;
  float local_44;
  uint local_3c;
  uint local_38;
  uint32_t i_1;
  uint32_t i;
  uint32_t samples;
  float *out;
  float *in;
  float rvolume;
  float lvolume;
  volume_control_segment_data *data;
  mixed_segment *segment_local;
  
  _rvolume = (undefined8 *)segment->data;
  if (*(float *)((long)_rvolume + 0x24) <= 0.0) {
    local_44 = 1.0;
  }
  else {
    local_44 = 1.0 - *(float *)((long)_rvolume + 0x24);
  }
  in._4_4_ = *(float *)(_rvolume + 4) * local_44;
  if (0.0 <= *(float *)((long)_rvolume + 0x24)) {
    local_4c = 1.0;
  }
  else {
    local_4c = *(float *)((long)_rvolume + 0x24) + 1.0;
  }
  in._0_4_ = *(float *)(_rvolume + 4) * local_4c;
  data = (volume_control_segment_data *)segment;
  mixed_buffer_request_read(&out,&i_1,(mixed_buffer *)*_rvolume);
  mixed_buffer_request_write((float **)&i,&i_1,(mixed_buffer *)_rvolume[2]);
  for (local_38 = 0; local_38 < i_1; local_38 = local_38 + 1) {
    _i[local_38] = out[local_38] * in._4_4_;
  }
  mixed_buffer_finish_read(i_1,(mixed_buffer *)*_rvolume);
  mixed_buffer_finish_write(i_1,(mixed_buffer *)_rvolume[2]);
  mixed_buffer_request_read(&out,&i_1,(mixed_buffer *)_rvolume[1]);
  mixed_buffer_request_write((float **)&i,&i_1,(mixed_buffer *)_rvolume[3]);
  for (local_3c = 0; local_3c < i_1; local_3c = local_3c + 1) {
    _i[local_3c] = out[local_3c] * in._0_4_;
  }
  mixed_buffer_finish_read(i_1,(mixed_buffer *)_rvolume[1]);
  mixed_buffer_finish_write(i_1,(mixed_buffer *)_rvolume[3]);
  return 1;
}

Assistant:

int volume_control_segment_mix(struct mixed_segment *segment){
  struct volume_control_segment_data *data = (struct volume_control_segment_data *)segment->data;
  float lvolume = data->volume * ((0.0<data->pan)?(1.0f-data->pan):1.0f);
  float rvolume = data->volume * ((data->pan<0.0)?(1.0f+data->pan):1.0f);
  float *restrict in, *restrict out;
  uint32_t samples;

  mixed_buffer_request_read(&in, &samples, data->in[MIXED_LEFT]);
  mixed_buffer_request_write(&out, &samples, data->out[MIXED_LEFT]);
  for(uint32_t i=0; i<samples; ++i)
    out[i] = in[i]*lvolume;
  mixed_buffer_finish_read(samples, data->in[MIXED_LEFT]);
  mixed_buffer_finish_write(samples, data->out[MIXED_LEFT]);
  
  mixed_buffer_request_read(&in, &samples, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&out, &samples, data->out[MIXED_RIGHT]);
  for(uint32_t i=0; i<samples; ++i)
    out[i] = in[i]*rvolume;
  mixed_buffer_finish_read(samples, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(samples, data->out[MIXED_RIGHT]);
  return 1;
}